

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# word_split.cpp
# Opt level: O0

void __thiscall
WordSplitStringTest_random_Test<signed_char>::TestBody
          (WordSplitStringTest_random_Test<signed_char> *this)

{
  bool bVar1;
  char *pcVar2;
  AssertHelper local_d8 [8];
  Message local_d0 [8];
  undefined1 local_c8 [8];
  AssertionResult gtest_ar;
  undefined1 local_a8 [8];
  vector<std::__cxx11::basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>,_std::allocator<std::__cxx11::basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>_>_>
  split_result;
  RandomWordTestData<signed_char,_std::__cxx11::basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>_>
  data;
  WordSplitStringTest_random_Test<signed_char> *this_local;
  
  data.m_token_indexes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  RandomWordTestData<signed_char,_std::__cxx11::basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>_>
  ::RandomWordTestData
            ((RandomWordTestData<signed_char,_std::__cxx11::basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>_>
              *)&split_result.
                 super__Vector_base<std::__cxx11::basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>,_std::allocator<std::__cxx11::basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage,'\0',0,0);
  jessilib::
  word_split<std::vector,_std::__cxx11::basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>_>
            ((container_type_conflict1 *)local_a8,
             (basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>
              *)&data.m_fixed_word_length,'\0');
  testing::internal::EqHelper::
  Compare<std::vector<std::__cxx11::basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>,_std::allocator<std::__cxx11::basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>_>_>,_std::vector<std::__cxx11::basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>,_std::allocator<std::__cxx11::basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>_>_>,_nullptr>
            ((EqHelper *)local_c8,"split_result","data.m_tokens",
             (vector<std::__cxx11::basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>,_std::allocator<std::__cxx11::basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>_>_>
              *)local_a8,
             (vector<std::__cxx11::basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>,_std::allocator<std::__cxx11::basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>_>_>
              *)((long)&data.m_str.field_2 + 8));
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c8);
  if (!bVar1) {
    testing::Message::Message(local_d0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_c8);
    testing::internal::AssertHelper::AssertHelper
              (local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/word_split.cpp"
               ,0xea,pcVar2);
    testing::internal::AssertHelper::operator=(local_d8,local_d0);
    testing::internal::AssertHelper::~AssertHelper(local_d8);
    testing::Message::~Message(local_d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c8);
  std::
  vector<std::__cxx11::basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>,_std::allocator<std::__cxx11::basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>,_std::allocator<std::__cxx11::basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>_>_>
             *)local_a8);
  RandomWordTestData<signed_char,_std::__cxx11::basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>_>
  ::~RandomWordTestData
            ((RandomWordTestData<signed_char,_std::__cxx11::basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>_>
              *)&split_result.
                 super__Vector_base<std::__cxx11::basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>,_std::allocator<std::__cxx11::basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

TYPED_TEST(WordSplitStringTest, random) {
	RandomWordTestData<TypeParam> data{};
	std::vector<std::basic_string<TypeParam>> split_result = word_split(data.m_str, default_delim<TypeParam>);
	EXPECT_EQ(split_result, data.m_tokens);
}